

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O3

void detectAndDisplay(Mat *frame)

{
  undefined8 *puVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  int in_R8D;
  ulong uVar8;
  long lVar9;
  int iVar10;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> face;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> fist;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> hand;
  Mat mask;
  Mat frame_gray;
  _InputArray local_1f0;
  void *local_1d8;
  void *pvStack_1d0;
  long local_1c8;
  void *local_1b8;
  void *pvStack_1b0;
  long local_1a8;
  void *local_198;
  void *pvStack_190;
  long local_188;
  _InputArray local_178;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  Mat local_f0 [96];
  Mat local_90 [96];
  
  local_198 = (void *)0x0;
  pvStack_190 = (void *)0x0;
  local_188 = 0;
  local_1a8 = 0;
  local_1b8 = (void *)0x0;
  pvStack_1b0 = (void *)0x0;
  local_1c8 = 0;
  local_1d8 = (void *)0x0;
  pvStack_1d0 = (void *)0x0;
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  local_178.sz.width = 0;
  local_178.sz.height = 0;
  local_178.flags = 0x1010000;
  local_1f0.sz.width = 0;
  local_1f0.sz.height = 0;
  local_1f0.flags = 0x2010000;
  local_1f0.obj = local_f0;
  local_178.obj = frame;
  cv::cvtColor((cv *)&local_178,&local_1f0,(_OutputArray *)0x6,0,in_R8D);
  iVar10 = 0;
  local_178.sz.width = 0;
  local_178.sz.height = 0;
  local_178.flags = 0x1010000;
  local_f8 = 0x1e0000001e;
  local_100 = 0;
  local_178.obj = frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,hand_classifier,&local_178,&local_198,2,2,&local_f8,&local_100);
  pvVar2 = pvStack_190;
  pvVar5 = pvStack_190;
  if (pvStack_190 != local_198) {
    uVar8 = 0;
    lVar9 = 0xc;
    iVar10 = 0;
    pvVar2 = local_198;
    do {
      if ((*(int *)((long)pvVar2 + lVar9 + -4) < 0xb0) || (*(int *)((long)pvVar2 + lVar9) < 0xb0)) {
        iVar10 = iVar10 + 1;
      }
      else {
        local_1f0.sz.width = 0;
        local_1f0.sz.height = 0;
        local_1f0.flags = 0x3010000;
        puVar1 = (undefined8 *)((long)pvVar2 + lVar9 + -0xc);
        local_138 = *puVar1;
        uStack_130 = puVar1[1];
        local_178.flags = 0;
        local_178._4_4_ = 0x406fe000;
        local_178.obj = (void *)0x406fe00000000000;
        local_178.sz.width = 0;
        local_178.sz.height = 0x406fe000;
        uStack_160 = 0;
        local_1f0.obj = frame;
        cv::rectangle(&local_1f0,&local_138,&local_178,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"palm",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        pvVar2 = local_198;
        pvVar5 = pvStack_190;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)pvVar5 - (long)pvVar2 >> 4));
  }
  local_178.sz.width = 0;
  local_178.sz.height = 0;
  local_178.flags = 0x1010000;
  local_108 = 0x1e0000001e;
  local_110 = 0;
  local_178.obj = frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,fist_classifier,&local_178,&local_1b8,2,2,&local_108,&local_110);
  pvVar3 = pvStack_1b0;
  pvVar6 = pvStack_1b0;
  if (pvStack_1b0 != local_1b8) {
    lVar9 = 0xc;
    uVar8 = 0;
    pvVar3 = local_1b8;
    do {
      if ((0x7d < *(int *)((long)pvVar3 + lVar9)) && (0x7d < *(int *)((long)pvVar3 + lVar9 + -4))) {
        local_1f0.sz.width = 0;
        local_1f0.sz.height = 0;
        local_1f0.flags = 0x3010000;
        puVar1 = (undefined8 *)((long)pvVar3 + lVar9 + -0xc);
        local_148 = *puVar1;
        uStack_140 = puVar1[1];
        local_178.flags = 0;
        local_178._4_4_ = 0x406fe000;
        local_178.obj = (void *)0x406fe00000000000;
        local_178.sz.width = 0;
        local_178.sz.height = 0x406fe000;
        uStack_160 = 0;
        local_1f0.obj = frame;
        cv::rectangle(&local_1f0,&local_148,&local_178,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"fist",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        pvVar3 = local_1b8;
        pvVar6 = pvStack_1b0;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)pvVar6 - (long)pvVar3 >> 4));
  }
  local_178.sz.width = 0;
  local_178.sz.height = 0;
  local_178.flags = 0x1010000;
  local_178.obj = local_f0;
  local_118 = 0x1e0000001e;
  local_120 = 0;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_classifier,&local_178,&local_1d8,2,2,&local_118,&local_120);
  pvVar4 = pvStack_1d0;
  pvVar7 = pvStack_1d0;
  if (pvStack_1d0 != local_1d8) {
    lVar9 = 0xc;
    uVar8 = 0;
    pvVar4 = local_1d8;
    do {
      if ((0x96 < *(int *)((long)pvVar4 + lVar9)) && (0x96 < *(int *)((long)pvVar4 + lVar9 + -4))) {
        local_1f0.sz.width = 0;
        local_1f0.sz.height = 0;
        local_1f0.flags = 0x3010000;
        puVar1 = (undefined8 *)((long)pvVar4 + lVar9 + -0xc);
        local_158 = *puVar1;
        uStack_150 = puVar1[1];
        local_178.flags = 0;
        local_178._4_4_ = 0x406fe000;
        local_178.obj = (Mat *)0x406fe00000000000;
        local_178.sz.width = 0;
        local_178.sz.height = 0;
        uStack_160 = 0;
        local_1f0.obj = frame;
        cv::rectangle(&local_1f0,&local_158,&local_178,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"face",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        pvVar4 = local_1d8;
        pvVar7 = pvStack_1d0;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)pvVar7 - (long)pvVar4 >> 4));
  }
  if ((uint)(pvVar7 == pvVar4) + (uint)(pvVar6 == pvVar3) + iVar10 + (uint)(pvVar5 == pvVar2) == 3)
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"none",4);
    std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  local_178.sz.width = 0;
  local_178.sz.height = 0;
  local_178.flags = 0x1010000;
  local_178.obj = frame;
  cv::imshow((string *)&window_name_abi_cxx11_,&local_178);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,local_1c8 - (long)local_1d8);
  }
  if (local_1b8 != (void *)0x0) {
    operator_delete(local_1b8,local_1a8 - (long)local_1b8);
  }
  if (local_198 != (void *)0x0) {
    operator_delete(local_198,local_188 - (long)local_198);
  }
  return;
}

Assistant:

void detectAndDisplay( Mat frame )
{
  int s1 = 0;
  std::vector<Rect> hand;
  std::vector<Rect> fist;
  std::vector<Rect> face;
  std::vector<Rect> left;
  Mat frame_gray,mask;
  //mask = frame;

  //blur(frame,frame,Size(3,3)); 
  cvtColor( frame, mask ,COLOR_BGR2GRAY );
  //equalizeHist( frame, frame_gray );
  //threshold( frame, frame_gray, threshold_value, max_binary_value, threshold_type );
  //threshold(frame,frame_gray,150,180,THRESH_BINARY);
  //adaptiveThreshold(frame, frame_gray, 255 , ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY ,11,2);
  //imshow( "Window-2", frame_gray );
  hand_classifier.detectMultiScale( frame, hand, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for( size_t i = 0; i < hand.size(); i++ )
{
//Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
//cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,hand[i]);
//cout<<hand[i]<<"\n";
if (hand[i].width>175 && hand[i].height>175)// cout<<"palm"<<"width:  "<<hand[i].width<<"  height: "<<hand[i].height<<"\n";
{
//cout<<"palm"<<"\n";
Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
outfile << "palm" << endl;
}
else s1++;
}

if (hand.size()==0) s1++;

//fist_classifier.detectMultiScale( frame_gray, fist, 1.1, 2, 0|CV_HAAR_SCALE_IMAGE, Size(30, 30) );
fist_classifier.detectMultiScale( frame, fist, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30) );

for ( size_t i = 0; i < fist.size(); i++ )
{
//Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
//cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,fist[i]);
if (fist[i].height>125 && fist[i].width > 125) //cout<<"fist-->height  "<<fist[i].height<<"  fist-->width  "<<fist[i].width <<"\n";
{
//cout<<"fist"<<"\n";
Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
outfile << "fist" << endl;
}
//else s1++;
}

if (fist.size()==0) s1++;

// smile classifier

//smile_classifier.detectMultiScale(frame,smile, 1.7, 22);
face_classifier.detectMultiScale( mask, face, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for (size_t i = 0;i< face.size();i++)
{
//Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);
if (face[i].height>150 && face[i].width>150)
{
Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);  
cv::rectangle(frame, face[i], cv::Scalar(255, 255, 0), 5);
//cout<<"smile-->height  "<<face[i].height<<"smile-->width "<<face[i].width <<"\n";
//cout<<"***"<<"face"<<"\n";
outfile << "face" << endl;
}
//else s1++;
//imshow("new-window", frame_gray);
}

if (face.size()==0) s1++;

if (s1 == 3) 
{
  outfile<< "none" << endl;
  //cout<<"none"<<"\n";
}
//cout<<s1<<endl;
imshow( window_name, frame);
}